

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_tests.cpp
# Opt level: O2

bool FilterTest(char *filter,STATE ranTestHoge,STATE ranHogeTest,STATE ranFooBar,STATE ranFooBaz,
               STATE ranFooBarTest,STATE ranFooQux)

{
  bool bVar1;
  int iVar2;
  UnitTestSource *this;
  UnitTest *pUVar3;
  undefined4 in_register_0000008c;
  uint local_244;
  AssertionResult iutest_ar;
  iuCodeMessage local_218;
  STATE ranFooBarTest_local;
  STATE ranFooBaz_local;
  STATE ranFooBar_local;
  STATE ranHogeTest_local;
  STATE ranTestHoge_local;
  char *filter_local;
  iuStreamMessage local_1c8;
  ScopedMessage scoped_message_0;
  
  TestHoge::state = 0;
  HogeTest::state = 0;
  FooBar::state = 0;
  FooBaz::state = 0;
  FooBarTest::state = 0;
  FooQux::state = 0;
  ranFooBarTest_local = ranFooBarTest;
  ranFooBaz_local = ranFooBaz;
  ranFooBar_local = ranFooBar;
  ranHogeTest_local = ranHogeTest;
  ranTestHoge_local = ranTestHoge;
  filter_local = filter;
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
               &local_1c8);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
            &local_1c8,filter);
  std::__cxx11::string::~string((string *)&local_1c8);
  this = iutest::UnitTestSource::GetInstance();
  iVar2 = iutest::UnitTestSource::Run(this);
  if (iVar2 == 0) {
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
    iutest::detail::iuStreamMessage::operator<<(&local_1c8,&filter_local);
    std::__cxx11::stringbuf::str();
    local_218.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
    ;
    local_218.m_line = 0x3b;
    iutest::AssertionHelper::ScopedMessage::ScopedMessage(&scoped_message_0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    iutest::internal::CmpHelperEQ<TestHoge::STATE,TestHoge::STATE>
              (&iutest_ar,(internal *)"ranTestHoge","TestHoge::state",(char *)&ranTestHoge_local,
               &TestHoge::state,(STATE *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x3d,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperEQ<HogeTest::STATE,HogeTest::STATE>
              (&iutest_ar,(internal *)"ranHogeTest","HogeTest::state",(char *)&ranHogeTest_local,
               &HogeTest::state,(STATE *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x3e,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperEQ<FooBar::STATE,FooBar::STATE>
              (&iutest_ar,(internal *)"ranFooBar","FooBar::state",(char *)&ranFooBar_local,
               &FooBar::state,(STATE *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x3f,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperEQ<FooBaz::STATE,FooBaz::STATE>
              (&iutest_ar,(internal *)"ranFooBaz","FooBaz::state",(char *)&ranFooBaz_local,
               &FooBaz::state,(STATE *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x40,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperEQ<FooBarTest::STATE,FooBarTest::STATE>
              (&iutest_ar,(internal *)"ranFooBarTest","FooBarTest::state",
               (char *)&ranFooBarTest_local,&FooBarTest::state,
               (STATE *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x41,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::internal::CmpHelperEQ<FooQux::STATE,FooQux::STATE>
              (&iutest_ar,(internal *)"ranFooQux","FooQux::state",(char *)&ranFooQux,&FooQux::state,
               (STATE *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x42,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_244 = (uint)(ranTestHoge_local != NOT_RAN);
    if (ranHogeTest_local != NOT_RAN) {
      local_244 = 2 - (ranTestHoge_local == NOT_RAN);
    }
    if (ranFooBar_local != NOT_RAN) {
      local_244 = local_244 + 1;
    }
    if (ranFooBaz_local != NOT_RAN) {
      local_244 = local_244 + 1;
    }
    if (ranFooBarTest_local != NOT_RAN) {
      local_244 = local_244 + 1;
    }
    if (ranFooQux != NOT_RAN) {
      local_244 = local_244 + 1;
    }
    pUVar3 = iutest::UnitTest::instance();
    local_1c8.m_stream.super_iu_stringstream._0_4_ = iutest::UnitTest::reportable_test_count(pUVar3)
    ;
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x12624d,
               "::iutest::UnitTest::GetInstance()->reportable_test_count()",(char *)&local_244,
               (int *)&local_1c8,(int *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x4e,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_1c8.m_stream.super_iu_stringstream._0_4_ = 0;
    pUVar3 = iutest::UnitTest::instance();
    local_218.m_message._M_dataplus._M_p._0_4_ =
         iutest::UnitTest::reportable_disabled_test_count(pUVar3);
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x12643c,
               "::iutest::UnitTest::GetInstance()->reportable_disabled_test_count()",
               (char *)&local_1c8,(int *)&local_218,
               (int *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x4f,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_1c8.m_stream.super_iu_stringstream._0_4_ = 6 - local_244;
    pUVar3 = iutest::UnitTest::instance();
    local_218.m_message._M_dataplus._M_p._0_4_ = iutest::UnitTest::skip_test_count(pUVar3);
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)"kTotal-nRan",
               "::iutest::UnitTest::GetInstance()->skip_test_count()",(char *)&local_1c8,
               (int *)&local_218,(int *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x53,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_1c8.m_stream.super_iu_stringstream._0_4_ = 0;
    pUVar3 = iutest::UnitTest::instance();
    local_218.m_message._M_dataplus._M_p._0_4_ =
         iutest::UnitTest::reportable_skip_test_count(pUVar3);
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x12643c,
               "::iutest::UnitTest::GetInstance()->reportable_skip_test_count()",(char *)&local_1c8,
               (int *)&local_218,(int *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x54,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_1c8.m_stream.super_iu_stringstream._0_4_ = 0;
    pUVar3 = iutest::UnitTest::instance();
    local_218.m_message._M_dataplus._M_p._0_4_ =
         iutest::UnitTest::reportable_test_run_skipped_count(pUVar3);
    iutest::internal::CmpHelperEQ<int,int>
              (&iutest_ar,(internal *)0x12643c,
               "::iutest::UnitTest::GetInstance()->reportable_test_run_skipped_count()",
               (char *)&local_1c8,(int *)&local_218,
               (int *)CONCAT44(in_register_0000008c,ranFooBarTest));
    if (iutest_ar.m_result == false) {
      memset(&local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1c8.m_stream);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filter_tests.cpp"
                 ,0x55,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,(Fixed *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1c8.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertionHelper::ScopedMessage::~ScopedMessage(&scoped_message_0);
    pUVar3 = iutest::UnitTest::instance();
    bVar1 = iutest::UnitTest::Passed(pUVar3);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FilterTest(const char* filter
    , TestHoge::STATE ranTestHoge
    , HogeTest::STATE ranHogeTest
    , FooBar::STATE ranFooBar
    , FooBaz::STATE ranFooBaz
    , FooBarTest::STATE ranFooBarTest
    , FooQux::STATE ranFooQux
)
{
    TestHoge::state = TestHoge::NOT_RAN;
    HogeTest::state = HogeTest::NOT_RAN;
    FooBar::state = FooBar::NOT_RAN;
    FooBaz::state = FooBaz::NOT_RAN;
    FooBarTest::state = FooBarTest::NOT_RAN;
    FooQux::state = FooQux::NOT_RAN;

    ::iutest::IUTEST_FLAG(filter) = filter;
    const int ret = IUTEST_RUN_ALL_TESTS();
    if( ret != 0 ) return false;

    {
        IUTEST_SCOPED_TRACE(filter);

        IUTEST_EXPECT_EQ( ranTestHoge  , TestHoge::state );
        IUTEST_EXPECT_EQ( ranHogeTest  , HogeTest::state );
        IUTEST_EXPECT_EQ( ranFooBar    , FooBar::state );
        IUTEST_EXPECT_EQ( ranFooBaz    , FooBaz::state );
        IUTEST_EXPECT_EQ( ranFooBarTest, FooBarTest::state );
        IUTEST_EXPECT_EQ( ranFooQux    , FooQux::state );

        int nRan = 0;

        if( ranTestHoge ) ++nRan;
        if( ranHogeTest ) ++nRan;
        if( ranFooBar ) ++nRan;
        if( ranFooBaz ) ++nRan;
        if( ranFooBarTest ) ++nRan;
        if( ranFooQux ) ++nRan;

#if !defined(IUTEST_USE_GTEST) || (defined(GTEST_MINOR) && GTEST_MINOR >= 0x07)
        IUTEST_EXPECT_EQ( nRan, ::iutest::UnitTest::GetInstance()->reportable_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_disabled_test_count() );
#endif
#if !defined(IUTEST_USE_GTEST)
        const int kTotal = 6;
        IUTEST_EXPECT_EQ( kTotal-nRan, ::iutest::UnitTest::GetInstance()->skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_skip_test_count() );
        IUTEST_EXPECT_EQ( 0, ::iutest::UnitTest::GetInstance()->reportable_test_run_skipped_count() );
#endif
    }
    return ::iutest::UnitTest::GetInstance()->Passed();
}